

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall FOptionMenuSliderBase::MouseEvent(FOptionMenuSliderBase *this,int type,int x,int y)

{
  DMenu *this_00;
  bool bVar1;
  int min;
  int max;
  int iVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double v;
  int slide_right;
  int slide_left;
  DOptionMenu *lm;
  int y_local;
  int x_local;
  int type_local;
  FOptionMenuSliderBase *this_local;
  
  this_00 = DMenu::CurrentMenu;
  if ((type == 0) ||
     (bVar1 = DOptionMenu::CheckFocus
                        ((DOptionMenu *)DMenu::CurrentMenu,&this->super_FOptionMenuItem), bVar1)) {
    if (type == 2) {
      DOptionMenu::ReleaseFocus((DOptionMenu *)this_00);
    }
    min = this->mDrawX + CleanXfac_1 * 8;
    max = min + (CleanXfac_1 * 0x50 >> ((byte)this->mSliderShort & 0x1f));
    if ((type == 0) && ((x < min || (max <= x)))) {
      this_local._7_1_ = true;
    }
    else {
      iVar2 = clamp<int>(x,min,max);
      dVar3 = this->mMin + ((double)(iVar2 - min) * (this->mMax - this->mMin)) / (double)(max - min)
      ;
      (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])();
      if ((dVar3 != extraout_XMM0_Qa) || (NAN(dVar3) || NAN(extraout_XMM0_Qa))) {
        (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x14])(dVar3);
      }
      if (type == 0) {
        DOptionMenu::SetFocus((DOptionMenu *)this_00,&this->super_FOptionMenuItem);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MouseEvent(int type, int x, int y)
	{
		DOptionMenu *lm = static_cast<DOptionMenu*>(DMenu::CurrentMenu);
		if (type != DMenu::MOUSE_Click)
		{
			if (!lm->CheckFocus(this)) return false;
		}
		if (type == DMenu::MOUSE_Release)
		{
			lm->ReleaseFocus();
		}

		int slide_left = mDrawX+8*CleanXfac_1;
		int slide_right = slide_left + (10*8*CleanXfac_1 >> mSliderShort);	// 12 char cells with 8 pixels each.

		if (type == DMenu::MOUSE_Click)
		{
			if (x < slide_left || x >= slide_right) return true;
		}

		x = clamp(x, slide_left, slide_right);
		double v = mMin + ((x - slide_left) * (mMax - mMin)) / (slide_right - slide_left);
		if (v != GetSliderValue())
		{
			SetSliderValue(v);
			//S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
		}
		if (type == DMenu::MOUSE_Click)
		{
			lm->SetFocus(this);
		}
		return true;
	}